

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
FIX::Session::nextResendRequest(Session *this,Message *resendRequest,UtcTimeStamp *now)

{
  SessionState *this_00;
  bool bVar1;
  int iVar2;
  BeginSeqNo *pBVar3;
  EndSeqNo *pEVar4;
  IntTConvertor<unsigned_long> *pIVar5;
  uint64_t uVar6;
  SEQNUM SVar7;
  uint64_t uVar8;
  unsigned_long value;
  unsigned_long value_00;
  uchar *in_R8;
  size_t in_R9;
  string beginString;
  MsgSeqNum msgSeqNum;
  EndSeqNo endSeqNo;
  BeginSeqNo beginSeqNo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  FieldBase local_190;
  FieldBase local_138;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  FieldBase local_80;
  
  iVar2 = verify(this,(EVP_PKEY_CTX *)resendRequest,(uchar *)0x0,0,in_R8,in_R9);
  if ((char)iVar2 == '\0') {
    return;
  }
  Mutex::lock(&this->m_mutex);
  pBVar3 = FieldMap::getField<FIX::BeginSeqNo>(&resendRequest->super_FieldMap);
  BeginSeqNo::BeginSeqNo((BeginSeqNo *)&local_80,pBVar3);
  pEVar4 = FieldMap::getField<FIX::EndSeqNo>(&resendRequest->super_FieldMap);
  EndSeqNo::EndSeqNo((EndSeqNo *)&local_138,pEVar4);
  pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)&local_80);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_c0,pIVar5,value);
  std::operator+(&local_a0,"Received ResendRequest FROM: ",&local_c0);
  std::operator+(&local_1b0,&local_a0," TO: ");
  pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)&local_138);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_e0,pIVar5,value_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
                 &local_1b0,&local_e0);
  this_00 = &this->m_state;
  SessionState::onEvent(this_00,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string
            ((string *)&local_1b0,
             (string *)&(this->m_sessionID).m_beginString.super_StringField.super_FieldBase.m_string
            );
  bVar1 = std::operator>=(&local_1b0,"FIX.4.2");
  if (((!bVar1) || (uVar6 = UInt64Field::getValue((UInt64Field *)&local_138), uVar6 != 0)) &&
     ((bVar1 = std::operator<=(&local_1b0,"FIX.4.2"), !bVar1 ||
      (uVar6 = UInt64Field::getValue((UInt64Field *)&local_138), uVar6 != 999999)))) {
    uVar6 = UInt64Field::getValue((UInt64Field *)&local_138);
    SVar7 = SessionState::getNextSenderMsgSeqNum(this_00);
    if (uVar6 < SVar7) goto LAB_001b0493;
  }
  SVar7 = SessionState::getNextSenderMsgSeqNum(this_00);
  EndSeqNo::EndSeqNo((EndSeqNo *)&local_190,SVar7 - 1);
  FieldBase::operator=(&local_138,&local_190);
  FieldBase::~FieldBase(&local_190);
LAB_001b0493:
  if (this->m_persistMessages == false) {
    uVar6 = UInt64Field::getValue((UInt64Field *)&local_138);
    EndSeqNo::EndSeqNo((EndSeqNo *)&local_190,uVar6 + 1);
    FieldBase::operator=(&local_138,&local_190);
    FieldBase::~FieldBase(&local_190);
    SVar7 = SessionState::getNextSenderMsgSeqNum(this_00);
    uVar6 = UInt64Field::getValue((UInt64Field *)&local_138);
    if (SVar7 < uVar6) {
      EndSeqNo::EndSeqNo((EndSeqNo *)&local_190,SVar7);
      FieldBase::operator=(&local_138,&local_190);
      FieldBase::~FieldBase(&local_190);
    }
    uVar6 = UInt64Field::getValue((UInt64Field *)&local_80);
    uVar8 = UInt64Field::getValue((UInt64Field *)&local_138);
    generateSequenceReset(this,uVar6,uVar8);
  }
  else {
    uVar6 = UInt64Field::getValue((UInt64Field *)&local_80);
    uVar8 = UInt64Field::getValue((UInt64Field *)&local_138);
    generateRetransmits(this,uVar6,uVar8);
  }
  MsgSeqNum::MsgSeqNum((MsgSeqNum *)&local_190,0);
  FieldMap::getField(&(resendRequest->m_header).super_FieldMap,&local_190);
  bVar1 = isTargetTooHigh(this,(MsgSeqNum *)&local_190);
  if ((!bVar1) && (bVar1 = isTargetTooLow(this,(MsgSeqNum *)&local_190), !bVar1)) {
    SessionState::incrNextTargetMsgSeqNum(this_00);
  }
  FieldBase::~FieldBase(&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  FieldBase::~FieldBase(&local_138);
  FieldBase::~FieldBase(&local_80);
  Mutex::unlock(&this->m_mutex);
  return;
}

Assistant:

void Session::nextResendRequest(const Message &resendRequest, const UtcTimeStamp &now) {
  if (!verify(resendRequest, false, false)) {
    return;
  }

  Locker l(m_mutex);

  auto beginSeqNo = resendRequest.getField<BeginSeqNo>();
  auto endSeqNo = resendRequest.getField<EndSeqNo>();

  m_state.onEvent(
      "Received ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(beginSeqNo)
      + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

  std::string beginString = m_sessionID.getBeginString();
  if ((beginString >= FIX::BeginString_FIX42 && endSeqNo == 0)
      || (beginString <= FIX::BeginString_FIX42 && endSeqNo == 999999) || (endSeqNo >= getExpectedSenderNum())) {
    endSeqNo = getExpectedSenderNum() - 1;
  }

  if (!m_persistMessages) {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    auto next = m_state.getNextSenderMsgSeqNum();
    if (endSeqNo > next) {
      endSeqNo = EndSeqNo(next);
    }
    generateSequenceReset(beginSeqNo, endSeqNo);
  } else {
    generateRetransmits(beginSeqNo.getValue(), endSeqNo.getValue());
  }

  MsgSeqNum msgSeqNum(0);
  resendRequest.getHeader().getField(msgSeqNum);
  if (!isTargetTooHigh(msgSeqNum) && !isTargetTooLow(msgSeqNum)) {
    m_state.incrNextTargetMsgSeqNum();
  }
}